

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::String(String *this,char c,int len)

{
  uchar *puVar1;
  int len_local;
  char c_local;
  String *this_local;
  
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (-1 < len) {
    (this->super_tagbstring).mlen = len + 1;
    (this->super_tagbstring).slen = len;
    puVar1 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar1;
  }
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0x55,"Failure in repeat(char) constructor");
  }
  else {
    if (0 < (this->super_tagbstring).slen) {
      memset((this->super_tagbstring).data,(uint)(byte)c,(long)(this->super_tagbstring).slen);
    }
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return;
}

Assistant:

String::String(char c, int len)
    {
        slen = mlen = 0; data = 0;
        if (len >= 0)
        {
            mlen = len + 1;
            slen = len;
            data = (uint8 * ) malloc(mlen);
        }
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in repeat(char) constructor");
        }
        else
        {
            if (slen > 0)    memset(data, c, slen);
            data[slen] = '\0';
        }
    }